

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  int iVar2;
  __pid_t _Var3;
  TestRole TVar4;
  size_t sVar5;
  int *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  long lVar11;
  int pipe_fd [2];
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  int local_80;
  int local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  string local_50;
  
  sVar5 = GetThreadCount();
  if (sVar5 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_e0,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       ,0x44e);
    Message::Message((Message *)&local_120);
    poVar1 = (ostream *)(local_120._M_dataplus._M_p + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (sVar5 == 0) {
      lVar11 = 0x26;
      pcVar10 = "couldn\'t detect the number of threads.";
    }
    else {
      lVar11 = 9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar10 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar10,lVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               " See https://github.com/google/googletest/blob/main/docs/advanced.md#death-tests-and-threads"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_140,(stringstream *)local_120._M_dataplus._M_p);
    if ((stringstream *)local_120._M_dataplus._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))(local_120._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_140._M_dataplus._M_p,local_140._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_e0);
  }
  iVar2 = pipe(&local_80);
  if (iVar2 != -1) {
    paVar9 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &DeathTest::last_death_test_message__abi_cxx11_,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar9) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var3 = fork();
    if (_Var3 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var3;
      if (_Var3 == 0) {
        while( true ) {
          iVar2 = close(local_80);
          if (iVar2 != -1) break;
          piVar6 = __errno_location();
          if (*piVar6 != 4) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"CHECK failed: File ","");
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_78,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                             );
            local_c0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p == paVar8) {
              local_c0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            }
            else {
              local_c0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_c0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_c0,", line ");
            local_100._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p == paVar8) {
              local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            }
            else {
              local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_100._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            local_54 = 0x463;
            StreamableToString<int>(&local_50,&local_54);
            std::operator+(&local_a0,&local_100,&local_50);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_a0,": ");
            local_e0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p == paVar8) {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_e0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_e0,"close(pipe_fd[0])");
            local_120._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p == paVar8) {
              local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            }
            else {
              local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_120._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_120," != -1");
            local_140._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p == paVar8) {
              local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_140._M_dataplus._M_p = (pointer)paVar9;
            }
            else {
              local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_140._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            DeathTestAbort(&local_140);
          }
        }
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_7c;
        UnitTest::GetInstance();
        (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
             false;
        g_in_fast_death_test_child = 1;
        TVar4 = EXECUTE_TEST;
      }
      else {
        while( true ) {
          iVar2 = close(local_7c);
          if (iVar2 != -1) break;
          piVar6 = __errno_location();
          if (*piVar6 != 4) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"CHECK failed: File ","");
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_78,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                             );
            local_c0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p == paVar8) {
              local_c0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            }
            else {
              local_c0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_c0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_c0,", line ");
            local_100._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p == paVar8) {
              local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            }
            else {
              local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_100._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            local_54 = 0x46f;
            StreamableToString<int>(&local_50,&local_54);
            std::operator+(&local_a0,&local_100,&local_50);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_a0,": ");
            local_e0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p == paVar8) {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_e0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_e0,"close(pipe_fd[1])");
            local_120._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p == paVar8) {
              local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            }
            else {
              local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_120._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_120," != -1");
            local_140._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p == paVar8) {
              local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_140._M_dataplus._M_p = (pointer)paVar9;
            }
            else {
              local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_140._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            DeathTestAbort(&local_140);
          }
        }
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_80;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        TVar4 = OVERSEE_TEST;
      }
      return TVar4;
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"CHECK failed: File ","");
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_c0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
    local_100._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar8) {
      local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_100._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_100,", line ");
    local_a0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == paVar8) {
      local_a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_a0._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p._0_4_ = 0x460;
    StreamableToString<int>(&local_78,(int *)&local_50);
    std::operator+(&local_e0,&local_a0,&local_78);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_e0,": ");
    local_120._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p == paVar8) {
      local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    }
    else {
      local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_120._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_120,"child_pid != -1");
    local_140._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == paVar8) {
      local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_140._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_140._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort(&local_140);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"CHECK failed: File ","");
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_c0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
  local_100._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p == paVar9) {
    local_100.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_100._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_100,", line ");
  local_a0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == paVar9) {
    local_a0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_a0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p._0_4_ = 0x452;
  StreamableToString<int>(&local_78,(int *)&local_50);
  std::operator+(&local_e0,&local_a0,&local_78);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_e0,": ");
  local_120._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p == paVar9) {
    local_120.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_120._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_120,"pipe(pipe_fd) != -1");
  local_140._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p == paVar9) {
    local_140.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  }
  else {
    local_140.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_140._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_140);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding(true);
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}